

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-bitflag.c
# Opt level: O2

_Bool flag_diff(bitflag *flags1,bitflag *flags2,size_t size)

{
  _Bool _Var1;
  size_t sVar2;
  
  _Var1 = false;
  for (sVar2 = 0; size != sVar2; sVar2 = sVar2 + 1) {
    _Var1 = (_Bool)(_Var1 | (flags2[sVar2] & flags1[sVar2]) != 0);
    flags1[sVar2] = ~flags2[sVar2] & flags1[sVar2];
  }
  return _Var1;
}

Assistant:

bool flag_diff(bitflag *flags1, const bitflag *flags2, const size_t size)
{
	size_t i;
	bool delta = false;

	for (i = 0; i < size; i++) {
		/* flag_is_inter() */
		if (flags1[i] & flags2[i]) delta = true;

		flags1[i] &= ~flags2[i];
	}

	return delta;
}